

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_uniform_block_active_visitor.cpp
# Opt level: O2

ir_visitor_status __thiscall
link_uniform_block_active_visitor::visit
          (link_uniform_block_active_visitor *this,ir_dereference_variable *ir)

{
  ir_variable *this_00;
  bool bVar1;
  link_uniform_block_active *plVar2;
  ir_visitor_status iVar3;
  
  this_00 = ir->var;
  bVar1 = ir_variable::is_in_buffer_block(this_00);
  iVar3 = visit_continue;
  if (bVar1) {
    bVar1 = ir_variable::is_interface_instance(this_00);
    if ((bVar1) && (this_00->type->field_0x4 == '\x11')) {
      __assert_fail("!var->is_interface_instance() || !var->type->is_array()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                    ,0x115,
                    "virtual ir_visitor_status link_uniform_block_active_visitor::visit(ir_dereference_variable *)"
                   );
    }
    plVar2 = process_block(this->mem_ctx,this->ht,this_00);
    if (plVar2 == (link_uniform_block_active *)0x0) {
      linker_error(this->prog,"uniform block `%s\' has mismatching definitions",
                   this_00->interface_type->name);
      (this->super_ir_hierarchical_visitor).field_0x31 = 0;
      iVar3 = visit_stop;
    }
    else {
      if (plVar2->array != (uniform_block_array_elements *)0x0) {
        __assert_fail("b->array == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                      ,0x122,
                      "virtual ir_visitor_status link_uniform_block_active_visitor::visit(ir_dereference_variable *)"
                     );
      }
      if (plVar2->type == (glsl_type *)0x0) {
        __assert_fail("b->type != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                      ,0x123,
                      "virtual ir_visitor_status link_uniform_block_active_visitor::visit(ir_dereference_variable *)"
                     );
      }
    }
  }
  return iVar3;
}

Assistant:

ir_visitor_status
link_uniform_block_active_visitor::visit(ir_dereference_variable *ir)
{
   ir_variable *var = ir->var;

   if (!var->is_in_buffer_block())
      return visit_continue;

   assert(!var->is_interface_instance() || !var->type->is_array());

   /* Process the block.  Bail if there was an error. */
   link_uniform_block_active *const b =
      process_block(this->mem_ctx, this->ht, var);
   if (b == NULL) {
      linker_error(this->prog,
                   "uniform block `%s' has mismatching definitions",
                   var->get_interface_type()->name);
      this->success = false;
      return visit_stop;
   }

   assert(b->array == NULL);
   assert(b->type != NULL);

   return visit_continue;
}